

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * print_value(cJSON *item,int depth,int fmt,printbuffer *p)

{
  cJSON *local_30;
  char *out;
  printbuffer *p_local;
  int fmt_local;
  int depth_local;
  cJSON *item_local;
  
  local_30 = (cJSON *)0x0;
  if (item == (cJSON *)0x0) {
    item_local = (cJSON *)0x0;
  }
  else {
    if (p == (printbuffer *)0x0) {
      switch((char)item->type) {
      case '\x01':
        local_30 = (cJSON *)cJSON_strdup("false");
        break;
      case '\x02':
        local_30 = (cJSON *)cJSON_strdup("true");
        break;
      case '\x04':
        local_30 = (cJSON *)cJSON_strdup("null");
        break;
      case '\b':
        local_30 = (cJSON *)print_number(item,(printbuffer *)0x0);
        break;
      case '\x10':
        local_30 = (cJSON *)print_string(item,(printbuffer *)0x0);
        break;
      case ' ':
        local_30 = (cJSON *)print_array(item,depth,fmt,(printbuffer *)0x0);
        break;
      case '@':
        local_30 = (cJSON *)print_object(item,depth,fmt,(printbuffer *)0x0);
      }
    }
    else {
      switch((char)item->type) {
      case '\x01':
        local_30 = (cJSON *)ensure(p,6);
        if (local_30 != (cJSON *)0x0) {
          strcpy((char *)local_30,"false");
        }
        break;
      case '\x02':
        local_30 = (cJSON *)ensure(p,5);
        if (local_30 != (cJSON *)0x0) {
          strcpy((char *)local_30,"true");
        }
        break;
      case '\x04':
        local_30 = (cJSON *)ensure(p,5);
        if (local_30 != (cJSON *)0x0) {
          strcpy((char *)local_30,"null");
        }
        break;
      case '\b':
        local_30 = (cJSON *)print_number(item,p);
        break;
      case '\x10':
        local_30 = (cJSON *)print_string(item,p);
        break;
      case ' ':
        local_30 = (cJSON *)print_array(item,depth,fmt,p);
        break;
      case '@':
        local_30 = (cJSON *)print_object(item,depth,fmt,p);
      }
    }
    item_local = local_30;
  }
  return (char *)item_local;
}

Assistant:

static char *print_value(cJSON *item,int depth,int fmt,printbuffer *p)
{
	char *out=0;
	if (!item) return 0;
	if (p)
	{
		switch ((item->type)&255)
		{
			case cJSON_NULL:	{out=ensure(p,5);	if (out) strcpy(out,"null");	break;}
			case cJSON_False:	{out=ensure(p,6);	if (out) strcpy(out,"false");	break;}
			case cJSON_True:	{out=ensure(p,5);	if (out) strcpy(out,"true");	break;}
			case cJSON_Number:	out=print_number(item,p);break;
			case cJSON_String:	out=print_string(item,p);break;
			case cJSON_Array:	out=print_array(item,depth,fmt,p);break;
			case cJSON_Object:	out=print_object(item,depth,fmt,p);break;
		}
	}
	else
	{
		switch ((item->type)&255)
		{
			case cJSON_NULL:	out=cJSON_strdup("null");	break;
			case cJSON_False:	out=cJSON_strdup("false");break;
			case cJSON_True:	out=cJSON_strdup("true"); break;
			case cJSON_Number:	out=print_number(item,0);break;
			case cJSON_String:	out=print_string(item,0);break;
			case cJSON_Array:	out=print_array(item,depth,fmt,0);break;
			case cJSON_Object:	out=print_object(item,depth,fmt,0);break;
		}
	}
	return out;
}